

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

void __thiscall HighsIis::addRow(HighsIis *this,HighsInt row,HighsInt status)

{
  iterator iVar1;
  HighsInt local_18;
  HighsInt local_14;
  
  _local_18 = CONCAT44(row,status);
  iVar1._M_current =
       (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->row_index_,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = row;
    (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->row_bound_,iVar1,&local_18);
  }
  else {
    *iVar1._M_current = status;
    (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void HighsIis::addRow(const HighsInt row, const HighsInt status) {
  this->row_index_.push_back(row);
  this->row_bound_.push_back(status);
}